

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSValueTest.cpp
# Opt level: O1

void test_dt_date(void)

{
  char cVar1;
  ulong uVar2;
  char cVar3;
  bool bVar4;
  XSValue_Data *pXVar5;
  XSValue *pXVar6;
  wchar16 *pwVar7;
  char *pcVar8;
  long lVar9;
  int iVar10;
  void *pvVar11;
  char *pcVar12;
  Status myStatus;
  Status myStatus_12;
  char iv_3 [11];
  char iv_2 [11];
  char iv_1 [11];
  char v_2 [12];
  char r_1 [11];
  char v_1_canrep [11];
  char v_3 [18];
  char r_8 [12];
  char r_3 [12];
  char r_2 [12];
  char v_2_canrep [12];
  char v_1 [18];
  char c_1 [14];
  char r_c [17];
  char r_b [17];
  char r_a [17];
  char r_9 [17];
  char r_7 [17];
  char r_6 [17];
  char r_5 [17];
  char r_4 [17];
  char v_3_canrep [18];
  char c_2 [15];
  char c_c [19];
  char c_b [19];
  char c_a [19];
  char c_9 [19];
  char c_8 [19];
  char c_7 [19];
  char c_6 [19];
  char c_5 [19];
  char c_4 [19];
  char c_3 [19];
  char *local_430;
  StrX local_428;
  Status local_414;
  ulong local_410;
  char local_408 [16];
  char local_3f8 [16];
  char local_3e8 [16];
  char local_3d8 [16];
  char local_3c8 [16];
  char local_3b8 [16];
  char local_3a8 [32];
  char local_388 [16];
  char local_378 [16];
  char local_368 [16];
  char local_358 [16];
  char local_348 [32];
  char local_328 [16];
  char local_318 [32];
  char local_2f8 [32];
  char local_2d8 [32];
  char local_2b8 [32];
  char local_298 [32];
  char local_278 [32];
  char local_258 [32];
  char local_238 [32];
  char local_218 [32];
  char local_1f8 [16];
  char local_1e8 [32];
  char local_1c8 [32];
  char local_1a8 [32];
  char local_188 [32];
  char local_168 [32];
  char local_148 [32];
  char local_128 [32];
  char local_108 [32];
  char local_e8 [32];
  char local_c8 [32];
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 uStack_88;
  undefined4 uStack_84;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined4 local_70;
  undefined4 uStack_6c;
  undefined4 uStack_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  
  builtin_strncpy(local_348,"   1991-05-31   \n",0x12);
  builtin_strncpy(local_3d8 + 8,"30Z",4);
  builtin_strncpy(local_3d8,"9999-06-",8);
  builtin_strncpy(local_3a8,"99991-07-31+14:00",0x12);
  builtin_strncpy(local_3e8,"2000-12-32",0xb);
  builtin_strncpy(local_3f8,"2001-02-29",0xb);
  builtin_strncpy(local_408,"2001-06-31",0xb);
  builtin_strncpy(local_3b8,"1991-05-31",0xb);
  builtin_strncpy(local_358 + 8,"30Z",4);
  builtin_strncpy(local_358,"9999-06-",8);
  builtin_strncpy(local_218,"99991-07-30-10:00",0x12);
  builtin_strncpy(local_328 + 8,"-31  ",6);
  builtin_strncpy(local_328," 1993-05",8);
  builtin_strncpy(local_3c8,"1993-05-31",0xb);
  builtin_strncpy(local_1f8," 1993-05-31Z  ",0xf);
  builtin_strncpy(local_368 + 8,"31Z",4);
  builtin_strncpy(local_368,"1993-05-",8);
  builtin_strncpy(local_c8," 1993-05-31+00:00 ",0x13);
  builtin_strncpy(local_378 + 8,"31Z",4);
  builtin_strncpy(local_378,"1993-05-",8);
  builtin_strncpy(local_e8," 1993-05-31+00:01 ",0x13);
  builtin_strncpy(local_238,"1993-05-31+00:01",0x11);
  builtin_strncpy(local_108," 1993-05-31+12:00 ",0x13);
  builtin_strncpy(local_258,"1993-05-31+12:00",0x11);
  builtin_strncpy(local_128," 1994-01-01+12:01 ",0x13);
  builtin_strncpy(local_278,"1993-12-31-11:59",0x11);
  builtin_strncpy(local_148," 1994-01-01+14:00 ",0x13);
  builtin_strncpy(local_298,"1993-12-31-10:00",0x11);
  builtin_strncpy(local_168," 1993-06-01-00:00 ",0x13);
  builtin_strncpy(local_388,"1993-06-01Z",0xc);
  builtin_strncpy(local_188," 1993-06-01-00:01 ",0x13);
  builtin_strncpy(local_2b8,"1993-06-01-00:01",0x11);
  builtin_strncpy(local_1a8," 1993-06-01-11:59 ",0x13);
  builtin_strncpy(local_2d8,"1993-06-01-11:59",0x11);
  builtin_strncpy(local_1c8," 1993-05-31-12:00 ",0x13);
  builtin_strncpy(local_2f8,"1993-06-01+12:00",0x11);
  builtin_strncpy(local_1e8," 1993-05-31-14:00 ",0x13);
  builtin_strncpy(local_318,"1993-06-01+10:00",0x11);
  local_430 = (char *)((ulong)local_430 & 0xffffffff00000000);
  local_428.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_348,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_428.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_348,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar3 = xercesc_4_0::XSValue::validate
                    (local_428.fUnicodeForm,dt_date,(Status *)&local_430,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_428);
  if (cVar3 == '\0') {
    StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xece,local_348,local_428.fLocalForm,1);
    StrX::~StrX(&local_428);
    errSeen = 1;
  }
  local_430 = (char *)((ulong)local_430 & 0xffffffff00000000);
  local_428.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_3d8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_428.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_3d8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar3 = xercesc_4_0::XSValue::validate
                    (local_428.fUnicodeForm,dt_date,(Status *)&local_430,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_428);
  if (cVar3 == '\0') {
    StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xecf,local_3d8,local_428.fLocalForm,1);
    StrX::~StrX(&local_428);
    errSeen = 1;
  }
  local_430 = (char *)((ulong)local_430 & 0xffffffff00000000);
  local_428.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_3a8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_428.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_3a8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar3 = xercesc_4_0::XSValue::validate
                    (local_428.fUnicodeForm,dt_date,(Status *)&local_430,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_428);
  if (cVar3 == '\0') {
    StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xed0,local_3a8,local_428.fLocalForm,1);
    StrX::~StrX(&local_428);
    errSeen = 1;
  }
  local_430 = (char *)((ulong)local_430 & 0xffffffff00000000);
  local_428.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_3e8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_428.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_3e8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar3 = xercesc_4_0::XSValue::validate
                    (local_428.fUnicodeForm,dt_date,(Status *)&local_430,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_428);
  if (cVar3 == '\0') {
    if ((int)local_430 != 6) {
      StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
      if (((ulong)local_430 & 0xffffffff) < 0xb) {
        pcVar12 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_430 & 0xffffffff];
      }
      else {
        pcVar12 = "st_UnknownType";
      }
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0xed3,local_3e8,local_428.fLocalForm,"st_FOCA0002",pcVar12);
      goto LAB_00122466;
    }
  }
  else {
    StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xed3,local_3e8,local_428.fLocalForm,0);
LAB_00122466:
    StrX::~StrX(&local_428);
    errSeen = 1;
  }
  local_430 = (char *)((ulong)local_430 & 0xffffffff00000000);
  local_428.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_3f8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_428.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_3f8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar3 = xercesc_4_0::XSValue::validate
                    (local_428.fUnicodeForm,dt_date,(Status *)&local_430,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_428);
  if (cVar3 == '\0') {
    if ((int)local_430 != 6) {
      StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
      if (((ulong)local_430 & 0xffffffff) < 0xb) {
        pcVar12 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_430 & 0xffffffff];
      }
      else {
        pcVar12 = "st_UnknownType";
      }
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0xed4,local_3f8,local_428.fLocalForm,"st_FOCA0002",pcVar12);
      goto LAB_0012256c;
    }
  }
  else {
    StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xed4,local_3f8,local_428.fLocalForm,0);
LAB_0012256c:
    StrX::~StrX(&local_428);
    errSeen = 1;
  }
  local_430 = (char *)((ulong)local_430 & 0xffffffff00000000);
  local_428.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_408,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_428.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_408,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar3 = xercesc_4_0::XSValue::validate
                    (local_428.fUnicodeForm,dt_date,(Status *)&local_430,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_428);
  if (cVar3 == '\0') {
    if ((int)local_430 == 6) goto LAB_0012267e;
    StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
    if (((ulong)local_430 & 0xffffffff) < 0xb) {
      pcVar12 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_430 & 0xffffffff];
    }
    else {
      pcVar12 = "st_UnknownType";
    }
    printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
           ,0xed5,local_408,local_428.fLocalForm,"st_FOCA0002",pcVar12);
  }
  else {
    StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xed5,local_408,local_428.fLocalForm,0);
  }
  StrX::~StrX(&local_428);
  errSeen = 1;
LAB_0012267e:
  iVar10 = 1;
  do {
    local_430 = (char *)((ulong)local_430 & 0xffffffff00000000);
    local_428.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_348,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_428.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_348,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pvVar11 = (void *)0x8;
    pXVar5 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_428.fUnicodeForm,dt_date,(Status *)&local_430,ver_10,iVar10 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_428);
    if (pXVar5 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xeef,local_348);
      StrX::~StrX(&local_428);
      errSeen = 1;
    }
    else {
      uStack_50 = 0x5000007c7;
      local_48 = 0x1f;
      uStack_44 = 0;
      uStack_40 = 0;
      uStack_3c = 0;
      uStack_38 = 0;
      uStack_34 = 0;
      bVar4 = compareActualValue(dt_date,*pXVar5,
                                 (XSValue_Data)
                                 ZEXT2440(CONCAT816(0x1f,CONCAT88(0x5000007c7,local_58))));
      if (!bVar4) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar5);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar11);
    }
    local_430 = (char *)((ulong)local_430 & 0xffffffff00000000);
    local_428.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_3d8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_428.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_3d8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pvVar11 = (void *)0x8;
    pXVar5 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_428.fUnicodeForm,dt_date,(Status *)&local_430,ver_10,iVar10 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_428);
    if (pXVar5 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xef0,local_3d8);
      StrX::~StrX(&local_428);
      errSeen = 1;
    }
    else {
      uStack_78 = 0x60000270f;
      local_70 = 0x1e;
      uStack_6c = 0;
      uStack_68 = 0;
      uStack_64 = 0;
      uStack_60 = 0;
      uStack_5c = 0;
      bVar4 = compareActualValue(dt_date,*pXVar5,
                                 (XSValue_Data)
                                 ZEXT2440(CONCAT816(0x1e,CONCAT88(0x60000270f,local_80))));
      if (!bVar4) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar5);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar11);
    }
    local_430 = (char *)((ulong)local_430 & 0xffffffff00000000);
    local_428.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_3a8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_428.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_3a8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pvVar11 = (void *)0x8;
    pXVar5 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_428.fUnicodeForm,dt_date,(Status *)&local_430,ver_10,iVar10 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_428);
    if (pXVar5 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xef1,local_3a8);
      StrX::~StrX(&local_428);
      errSeen = 1;
    }
    else {
      uStack_a0 = 0x700018697;
      local_98 = 0x1e;
      uStack_94 = 0;
      uStack_90 = 0;
      uStack_8c = 0;
      uStack_88 = 0;
      uStack_84 = 0;
      bVar4 = compareActualValue(dt_date,*pXVar5,
                                 (XSValue_Data)
                                 ZEXT2440(CONCAT816(0x1e,CONCAT88(0x700018697,local_a8))));
      if (!bVar4) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar5);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar11);
    }
    local_430 = (char *)((ulong)local_430 & 0xffffffff00000000);
    local_428.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_3e8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_428.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_3e8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar6 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_428.fUnicodeForm,dt_date,(Status *)&local_430,ver_10,iVar10 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_428);
    if (pXVar6 == (XSValue *)0x0) {
      if ((int)local_430 != 6) {
        StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
        pcVar12 = "st_UnknownType";
        if (((ulong)local_430 & 0xffffffff) < 0xb) {
          pcVar12 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_430 & 0xffffffff];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0xef4,local_3e8,local_428.fLocalForm,"st_FOCA0002",pcVar12);
        StrX::~StrX(&local_428);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
      pvVar11 = (void *)0xef4;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xef4,local_3e8);
      StrX::~StrX(&local_428);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar6);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar6,pvVar11);
    }
    local_430 = (char *)((ulong)local_430 & 0xffffffff00000000);
    local_428.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_3f8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_428.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_3f8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar6 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_428.fUnicodeForm,dt_date,(Status *)&local_430,ver_10,iVar10 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_428);
    if (pXVar6 == (XSValue *)0x0) {
      if ((int)local_430 != 6) {
        StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
        pcVar12 = "st_UnknownType";
        if (((ulong)local_430 & 0xffffffff) < 0xb) {
          pcVar12 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_430 & 0xffffffff];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0xef5,local_3f8,local_428.fLocalForm,"st_FOCA0002",pcVar12);
        StrX::~StrX(&local_428);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
      pvVar11 = (void *)0xef5;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xef5,local_3f8);
      StrX::~StrX(&local_428);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar6);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar6,pvVar11);
    }
    local_430 = (char *)((ulong)local_430 & 0xffffffff00000000);
    local_428.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_408,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_428.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_408,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar6 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_428.fUnicodeForm,dt_date,(Status *)&local_430,ver_10,iVar10 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_428);
    if (pXVar6 == (XSValue *)0x0) {
      if ((int)local_430 != 6) {
        StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
        pcVar12 = "st_UnknownType";
        if (((ulong)local_430 & 0xffffffff) < 0xb) {
          pcVar12 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_430 & 0xffffffff];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0xef6,local_408,local_428.fLocalForm,"st_FOCA0002",pcVar12);
        StrX::~StrX(&local_428);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
      pvVar11 = (void *)0xef6;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xef6,local_408);
      StrX::~StrX(&local_428);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar6);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar6,pvVar11);
    }
    iVar10 = iVar10 + -1;
  } while (iVar10 == 0);
  local_410 = 0;
  do {
    iVar10 = (int)local_410;
    local_414 = st_Init;
    local_428.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_348,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_428.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_348,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar7 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_428.fUnicodeForm,dt_date,&local_414,ver_10,iVar10 == 0,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_428);
    if (pwVar7 == (wchar16 *)0x0) {
      StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xf12,local_348);
      StrX::~StrX(&local_428);
      errSeen = 1;
      iVar10 = (int)local_410;
    }
    else {
      local_430 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar12 = local_3b8;
      iVar10 = (int)local_410;
      if (local_430 != pcVar12) {
        pcVar8 = local_430;
        if (local_430 == (char *)0x0) {
LAB_00122eb0:
          if (*pcVar12 == '\0') goto LAB_00122f00;
        }
        else {
          do {
            cVar3 = *pcVar8;
            if (cVar3 == '\0') goto LAB_00122eb0;
            pcVar8 = pcVar8 + 1;
            cVar1 = *pcVar12;
            pcVar12 = pcVar12 + 1;
          } while (cVar3 == cVar1);
        }
        StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0xf12,local_348,local_428.fLocalForm,local_430,local_3b8);
        StrX::~StrX(&local_428);
        errSeen = 1;
      }
LAB_00122f00:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar7);
      xercesc_4_0::XMLString::release(&local_430,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_414 = st_Init;
    local_428.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_3d8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_428.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_3d8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar7 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_428.fUnicodeForm,dt_date,&local_414,ver_10,iVar10 == 0,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_428);
    if (pwVar7 == (wchar16 *)0x0) {
      StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xf13,local_3d8);
      StrX::~StrX(&local_428);
      errSeen = 1;
      iVar10 = (int)local_410;
    }
    else {
      local_430 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar12 = local_358;
      iVar10 = (int)local_410;
      if (local_430 != pcVar12) {
        pcVar8 = local_430;
        if (local_430 == (char *)0x0) {
LAB_00123006:
          if (*pcVar12 == '\0') goto LAB_00123056;
        }
        else {
          do {
            cVar3 = *pcVar8;
            if (cVar3 == '\0') goto LAB_00123006;
            pcVar8 = pcVar8 + 1;
            cVar1 = *pcVar12;
            pcVar12 = pcVar12 + 1;
          } while (cVar3 == cVar1);
        }
        StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0xf13,local_3d8,local_428.fLocalForm,local_430,local_358);
        StrX::~StrX(&local_428);
        errSeen = 1;
      }
LAB_00123056:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar7);
      xercesc_4_0::XMLString::release(&local_430,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_414 = st_Init;
    local_428.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_3a8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_428.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_3a8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar7 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_428.fUnicodeForm,dt_date,&local_414,ver_10,iVar10 == 0,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_428);
    if (pwVar7 == (wchar16 *)0x0) {
      StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xf14,local_3a8);
      StrX::~StrX(&local_428);
      errSeen = 1;
    }
    else {
      local_430 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar12 = local_218;
      if (local_430 != pcVar12) {
        pcVar8 = local_430;
        if (local_430 == (char *)0x0) {
LAB_00123154:
          if (*pcVar12 == '\0') goto LAB_001231a4;
        }
        else {
          do {
            cVar3 = *pcVar8;
            if (cVar3 == '\0') goto LAB_00123154;
            pcVar8 = pcVar8 + 1;
            cVar1 = *pcVar12;
            pcVar12 = pcVar12 + 1;
          } while (cVar3 == cVar1);
        }
        StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0xf14,local_3a8,local_428.fLocalForm,local_430,local_218);
        StrX::~StrX(&local_428);
        errSeen = 1;
      }
LAB_001231a4:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar7);
      xercesc_4_0::XMLString::release(&local_430,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_414 = st_Init;
    local_428.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_328,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_428.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_328,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar7 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_428.fUnicodeForm,dt_date,&local_414,ver_10,iVar10 == 0,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_428);
    if (pwVar7 == (wchar16 *)0x0) {
      StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xf16,local_328);
      StrX::~StrX(&local_428);
      errSeen = 1;
    }
    else {
      local_430 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar12 = local_3c8;
      if (local_430 != pcVar12) {
        pcVar8 = local_430;
        if (local_430 == (char *)0x0) {
LAB_001232a2:
          if (*pcVar12 == '\0') goto LAB_001232f2;
        }
        else {
          do {
            cVar3 = *pcVar8;
            if (cVar3 == '\0') goto LAB_001232a2;
            pcVar8 = pcVar8 + 1;
            cVar1 = *pcVar12;
            pcVar12 = pcVar12 + 1;
          } while (cVar3 == cVar1);
        }
        StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0xf16,local_328,local_428.fLocalForm,local_430,local_3c8);
        StrX::~StrX(&local_428);
        errSeen = 1;
      }
LAB_001232f2:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar7);
      xercesc_4_0::XMLString::release(&local_430,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_414 = st_Init;
    local_428.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_1f8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_428.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_1f8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar7 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_428.fUnicodeForm,dt_date,&local_414,ver_10,iVar10 == 0,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_428);
    if (pwVar7 == (wchar16 *)0x0) {
      StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xf17,local_1f8);
      StrX::~StrX(&local_428);
      errSeen = 1;
    }
    else {
      local_430 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar12 = local_368;
      if (local_430 != pcVar12) {
        pcVar8 = local_430;
        if (local_430 == (char *)0x0) {
LAB_001233f0:
          if (*pcVar12 == '\0') goto LAB_00123440;
        }
        else {
          do {
            cVar3 = *pcVar8;
            if (cVar3 == '\0') goto LAB_001233f0;
            pcVar8 = pcVar8 + 1;
            cVar1 = *pcVar12;
            pcVar12 = pcVar12 + 1;
          } while (cVar3 == cVar1);
        }
        StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0xf17,local_1f8,local_428.fLocalForm,local_430,local_368);
        StrX::~StrX(&local_428);
        errSeen = 1;
      }
LAB_00123440:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar7);
      xercesc_4_0::XMLString::release(&local_430,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_414 = st_Init;
    local_428.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_428.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar7 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_428.fUnicodeForm,dt_date,&local_414,ver_10,iVar10 == 0,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_428);
    if (pwVar7 == (wchar16 *)0x0) {
      StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xf18,local_c8);
      StrX::~StrX(&local_428);
      errSeen = 1;
    }
    else {
      local_430 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar12 = local_378;
      if (local_430 != pcVar12) {
        pcVar8 = local_430;
        if (local_430 == (char *)0x0) {
LAB_0012353e:
          if (*pcVar12 == '\0') goto LAB_0012358e;
        }
        else {
          do {
            cVar3 = *pcVar8;
            if (cVar3 == '\0') goto LAB_0012353e;
            pcVar8 = pcVar8 + 1;
            cVar1 = *pcVar12;
            pcVar12 = pcVar12 + 1;
          } while (cVar3 == cVar1);
        }
        StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0xf18,local_c8,local_428.fLocalForm,local_430,local_378);
        StrX::~StrX(&local_428);
        errSeen = 1;
      }
LAB_0012358e:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar7);
      xercesc_4_0::XMLString::release(&local_430,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_414 = st_Init;
    local_428.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_e8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_428.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_e8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar7 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_428.fUnicodeForm,dt_date,&local_414,ver_10,iVar10 == 0,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_428);
    if (pwVar7 == (wchar16 *)0x0) {
      StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xf19,local_e8);
      StrX::~StrX(&local_428);
      errSeen = 1;
    }
    else {
      local_430 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar12 = local_238;
      if (local_430 != pcVar12) {
        pcVar8 = local_430;
        if (local_430 == (char *)0x0) {
LAB_0012368c:
          if (*pcVar12 == '\0') goto LAB_001236dc;
        }
        else {
          do {
            cVar3 = *pcVar8;
            if (cVar3 == '\0') goto LAB_0012368c;
            pcVar8 = pcVar8 + 1;
            cVar1 = *pcVar12;
            pcVar12 = pcVar12 + 1;
          } while (cVar3 == cVar1);
        }
        StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0xf19,local_e8,local_428.fLocalForm,local_430,local_238);
        StrX::~StrX(&local_428);
        errSeen = 1;
      }
LAB_001236dc:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar7);
      xercesc_4_0::XMLString::release(&local_430,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_414 = st_Init;
    local_428.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_108,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_428.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_108,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar7 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_428.fUnicodeForm,dt_date,&local_414,ver_10,iVar10 == 0,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_428);
    if (pwVar7 == (wchar16 *)0x0) {
      StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xf1a,local_108);
      StrX::~StrX(&local_428);
      errSeen = 1;
    }
    else {
      local_430 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar12 = local_258;
      if (local_430 != pcVar12) {
        pcVar8 = local_430;
        if (local_430 == (char *)0x0) {
LAB_001237da:
          if (*pcVar12 == '\0') goto LAB_0012382a;
        }
        else {
          do {
            cVar3 = *pcVar8;
            if (cVar3 == '\0') goto LAB_001237da;
            pcVar8 = pcVar8 + 1;
            cVar1 = *pcVar12;
            pcVar12 = pcVar12 + 1;
          } while (cVar3 == cVar1);
        }
        StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0xf1a,local_108,local_428.fLocalForm,local_430,local_258);
        StrX::~StrX(&local_428);
        errSeen = 1;
      }
LAB_0012382a:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar7);
      xercesc_4_0::XMLString::release(&local_430,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_414 = st_Init;
    local_428.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_128,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_428.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_128,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar7 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_428.fUnicodeForm,dt_date,&local_414,ver_10,iVar10 == 0,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_428);
    if (pwVar7 == (wchar16 *)0x0) {
      StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xf1b,local_128);
      StrX::~StrX(&local_428);
      errSeen = 1;
    }
    else {
      local_430 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar12 = local_278;
      if (local_430 != pcVar12) {
        pcVar8 = local_430;
        if (local_430 == (char *)0x0) {
LAB_00123928:
          if (*pcVar12 == '\0') goto LAB_00123978;
        }
        else {
          do {
            cVar3 = *pcVar8;
            if (cVar3 == '\0') goto LAB_00123928;
            pcVar8 = pcVar8 + 1;
            cVar1 = *pcVar12;
            pcVar12 = pcVar12 + 1;
          } while (cVar3 == cVar1);
        }
        StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0xf1b,local_128,local_428.fLocalForm,local_430,local_278);
        StrX::~StrX(&local_428);
        errSeen = 1;
      }
LAB_00123978:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar7);
      xercesc_4_0::XMLString::release(&local_430,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_414 = st_Init;
    local_428.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_148,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_428.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_148,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar7 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_428.fUnicodeForm,dt_date,&local_414,ver_10,iVar10 == 0,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_428);
    if (pwVar7 == (wchar16 *)0x0) {
      StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xf1c,local_148);
      StrX::~StrX(&local_428);
      errSeen = 1;
    }
    else {
      local_430 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar12 = local_298;
      if (local_430 != pcVar12) {
        pcVar8 = local_430;
        if (local_430 == (char *)0x0) {
LAB_00123a76:
          if (*pcVar12 == '\0') goto LAB_00123ac6;
        }
        else {
          do {
            cVar3 = *pcVar8;
            if (cVar3 == '\0') goto LAB_00123a76;
            pcVar8 = pcVar8 + 1;
            cVar1 = *pcVar12;
            pcVar12 = pcVar12 + 1;
          } while (cVar3 == cVar1);
        }
        StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0xf1c,local_148,local_428.fLocalForm,local_430,local_298);
        StrX::~StrX(&local_428);
        errSeen = 1;
      }
LAB_00123ac6:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar7);
      xercesc_4_0::XMLString::release(&local_430,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_414 = st_Init;
    local_428.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_168,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_428.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_168,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar7 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_428.fUnicodeForm,dt_date,&local_414,ver_10,iVar10 == 0,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_428);
    if (pwVar7 == (wchar16 *)0x0) {
      StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xf1d,local_168);
      StrX::~StrX(&local_428);
      errSeen = 1;
    }
    else {
      local_430 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar12 = local_388;
      if (local_430 != pcVar12) {
        pcVar8 = local_430;
        if (local_430 == (char *)0x0) {
LAB_00123bc4:
          if (*pcVar12 == '\0') goto LAB_00123c14;
        }
        else {
          do {
            cVar3 = *pcVar8;
            if (cVar3 == '\0') goto LAB_00123bc4;
            pcVar8 = pcVar8 + 1;
            cVar1 = *pcVar12;
            pcVar12 = pcVar12 + 1;
          } while (cVar3 == cVar1);
        }
        StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0xf1d,local_168,local_428.fLocalForm,local_430,local_388);
        StrX::~StrX(&local_428);
        errSeen = 1;
      }
LAB_00123c14:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar7);
      xercesc_4_0::XMLString::release(&local_430,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_414 = st_Init;
    local_428.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_188,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_428.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_188,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar7 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_428.fUnicodeForm,dt_date,&local_414,ver_10,iVar10 == 0,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_428);
    if (pwVar7 == (wchar16 *)0x0) {
      StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xf1e,local_188);
      StrX::~StrX(&local_428);
      errSeen = 1;
    }
    else {
      local_430 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar12 = local_2b8;
      if (local_430 != pcVar12) {
        pcVar8 = local_430;
        if (local_430 == (char *)0x0) {
LAB_00123d12:
          if (*pcVar12 == '\0') goto LAB_00123d62;
        }
        else {
          do {
            cVar3 = *pcVar8;
            if (cVar3 == '\0') goto LAB_00123d12;
            pcVar8 = pcVar8 + 1;
            cVar1 = *pcVar12;
            pcVar12 = pcVar12 + 1;
          } while (cVar3 == cVar1);
        }
        StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0xf1e,local_188,local_428.fLocalForm,local_430,local_2b8);
        StrX::~StrX(&local_428);
        errSeen = 1;
      }
LAB_00123d62:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar7);
      xercesc_4_0::XMLString::release(&local_430,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_414 = st_Init;
    local_428.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_1a8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_428.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_1a8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar7 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_428.fUnicodeForm,dt_date,&local_414,ver_10,iVar10 == 0,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_428);
    if (pwVar7 == (wchar16 *)0x0) {
      StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xf1f,local_1a8);
      StrX::~StrX(&local_428);
      errSeen = 1;
    }
    else {
      local_430 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar12 = local_2d8;
      if (local_430 != pcVar12) {
        pcVar8 = local_430;
        if (local_430 == (char *)0x0) {
LAB_00123e60:
          if (*pcVar12 == '\0') goto LAB_00123eb0;
        }
        else {
          do {
            cVar3 = *pcVar8;
            if (cVar3 == '\0') goto LAB_00123e60;
            pcVar8 = pcVar8 + 1;
            cVar1 = *pcVar12;
            pcVar12 = pcVar12 + 1;
          } while (cVar3 == cVar1);
        }
        StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0xf1f,local_1a8,local_428.fLocalForm,local_430,local_2d8);
        StrX::~StrX(&local_428);
        errSeen = 1;
      }
LAB_00123eb0:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar7);
      xercesc_4_0::XMLString::release(&local_430,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_414 = st_Init;
    local_428.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_1c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_428.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_1c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar7 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_428.fUnicodeForm,dt_date,&local_414,ver_10,iVar10 == 0,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_428);
    if (pwVar7 == (wchar16 *)0x0) {
      StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xf20,local_1c8);
      StrX::~StrX(&local_428);
      errSeen = 1;
    }
    else {
      local_430 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar12 = local_2f8;
      if (local_430 != pcVar12) {
        pcVar8 = local_430;
        if (local_430 == (char *)0x0) {
LAB_00123fae:
          if (*pcVar12 == '\0') goto LAB_00123ffe;
        }
        else {
          do {
            cVar3 = *pcVar8;
            if (cVar3 == '\0') goto LAB_00123fae;
            pcVar8 = pcVar8 + 1;
            cVar1 = *pcVar12;
            pcVar12 = pcVar12 + 1;
          } while (cVar3 == cVar1);
        }
        StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0xf20,local_1c8,local_428.fLocalForm,local_430,local_2f8);
        StrX::~StrX(&local_428);
        errSeen = 1;
      }
LAB_00123ffe:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar7);
      xercesc_4_0::XMLString::release(&local_430,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_414 = st_Init;
    local_428.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_1e8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_428.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_1e8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar7 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_428.fUnicodeForm,dt_date,&local_414,ver_10,iVar10 == 0,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_428);
    if (pwVar7 == (wchar16 *)0x0) {
      StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xf21,local_1e8);
      StrX::~StrX(&local_428);
      errSeen = 1;
    }
    else {
      local_430 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar12 = local_318;
      if (local_430 != pcVar12) {
        pcVar8 = local_430;
        if (local_430 == (char *)0x0) {
LAB_00124101:
          if (*pcVar12 == '\0') goto LAB_00124151;
        }
        else {
          do {
            cVar3 = *pcVar8;
            if (cVar3 == '\0') goto LAB_00124101;
            pcVar8 = pcVar8 + 1;
            cVar1 = *pcVar12;
            pcVar12 = pcVar12 + 1;
          } while (cVar3 == cVar1);
        }
        StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0xf21,local_1e8,local_428.fLocalForm,local_430,local_318);
        StrX::~StrX(&local_428);
        errSeen = 1;
      }
LAB_00124151:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar7);
      xercesc_4_0::XMLString::release(&local_430,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    bVar4 = (int)local_410 == 0;
    local_430 = (char *)((ulong)local_430 & 0xffffffff00000000);
    local_428.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_3e8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_428.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_3e8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_428.fUnicodeForm,dt_date,(Status *)&local_430,ver_10,bVar4,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_428);
    uVar2 = local_410;
    if (lVar9 == 0) {
      if ((int)local_430 != 6) {
        StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
        pcVar12 = "st_UnknownType";
        if (((ulong)local_430 & 0xffffffff) < 0xb) {
          pcVar12 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_430 & 0xffffffff];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0xf24,local_3e8,local_428.fLocalForm,"st_FOCA0002",pcVar12);
        StrX::~StrX(&local_428);
        goto LAB_0012427f;
      }
    }
    else {
      StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xf24,local_3e8);
      StrX::~StrX(&local_428);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar9);
LAB_0012427f:
      errSeen = 1;
    }
    local_430 = (char *)((ulong)local_430 & 0xffffffff00000000);
    local_428.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_3f8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_428.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_3f8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_428.fUnicodeForm,dt_date,(Status *)&local_430,ver_10,(int)uVar2 == 0,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_428);
    uVar2 = local_410;
    if (lVar9 == 0) {
      if ((int)local_430 != 6) {
        StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
        pcVar12 = "st_UnknownType";
        if (((ulong)local_430 & 0xffffffff) < 0xb) {
          pcVar12 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_430 & 0xffffffff];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0xf25,local_3f8,local_428.fLocalForm,"st_FOCA0002",pcVar12);
        StrX::~StrX(&local_428);
        goto LAB_00124395;
      }
    }
    else {
      StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xf25,local_3f8);
      StrX::~StrX(&local_428);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar9);
LAB_00124395:
      errSeen = 1;
    }
    local_430 = (char *)((ulong)local_430 & 0xffffffff00000000);
    local_428.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_408,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_428.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_408,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_428.fUnicodeForm,dt_date,(Status *)&local_430,ver_10,(int)uVar2 == 0,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_428);
    uVar2 = local_410;
    if (lVar9 == 0) {
      if ((int)local_430 != 6) {
        StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
        pcVar12 = "st_UnknownType";
        if (((ulong)local_430 & 0xffffffff) < 0xb) {
          pcVar12 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_430 & 0xffffffff];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0xf26,local_408,local_428.fLocalForm,"st_FOCA0002",pcVar12);
        StrX::~StrX(&local_428);
        goto LAB_001244b2;
      }
    }
    else {
      StrX::StrX(&local_428,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xf26,local_408);
      StrX::~StrX(&local_428);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar9);
LAB_001244b2:
      errSeen = 1;
    }
    local_410 = (ulong)((int)uVar2 + 1);
    if ((int)uVar2 != 0) {
      return;
    }
  } while( true );
}

Assistant:

void test_dt_date()
{
    const XSValue::DataType dt = XSValue::dt_date;
    bool  toValidate = true;

    const char v_1[]="   1991-05-31   \n";
    const char v_2[]="9999-06-30Z";
    const char v_3[]="99991-07-31+14:00";

    const char iv_1[]="2000-12-32";
    const char iv_2[]="2001-02-29";
    const char iv_3[]="2001-06-31";

    XSValue::XSValue_Data act_v_ran_v_1;
    XSValue::XSValue_Data act_v_ran_v_2;
    XSValue::XSValue_Data act_v_ran_v_3;

    const char v_1_canrep[]="1991-05-31";
    const char v_2_canrep[]="9999-06-30Z";
    const char v_3_canrep[]="99991-07-30-10:00";

    /*
     * Case Date               Actual Value    Canonical Value
     *    1 yyyy-mm-dd         yyyy-mm-dd          yyyy-mm-dd
     *    2 yyyy-mm-ddZ        yyyy-mm-ddT00:00Z   yyyy-mm-ddZ
     *    3 yyyy-mm-dd+00:00   yyyy-mm-ddT00:00Z   yyyy-mm-ddZ
     *    4 yyyy-mm-dd+00:01   YYYY-MM-DCT23:59Z   yyyy-mm-dd+00:01
     *    5 yyyy-mm-dd+12:00   YYYY-MM-DCT12:00Z   yyyy-mm-dd+12:00
     *    6 yyyy-mm-dd+12:01   YYYY-MM-DCT11:59Z   YYYY-MM-DC-11:59
     *    7 yyyy-mm-dd+14:00   YYYY-MM-DCT10:00Z   YYYY-MM-DC-10:00
     *    8 yyyy-mm-dd-00:00   yyyy-mm-ddT00:00Z   yyyy-mm-ddZ
     *    9 yyyy-mm-dd-00:01   yyyy-mm-ddT00:01Z   yyyy-mm-dd-00:01
     *   11 yyyy-mm-dd-11:59   yyyy-mm-ddT11:59Z   YYYY-MM-DD-11:59
     *   10 yyyy-mm-dd-12:00   yyyy-mm-ddT12:00Z   YYYY-MM-DD+12:00
     *   12 yyyy-mm-dd-14:00   yyyy-mm-ddT14:00Z   YYYY-MM-DD+10:00
     */

    const char c_1[] = " 1993-05-31  ";       const char r_1[] = "1993-05-31";
    const char c_2[] = " 1993-05-31Z  ";      const char r_2[] = "1993-05-31Z";
    const char c_3[] = " 1993-05-31+00:00 ";  const char r_3[] = "1993-05-31Z";
    const char c_4[] = " 1993-05-31+00:01 ";  const char r_4[] = "1993-05-31+00:01";
    const char c_5[] = " 1993-05-31+12:00 ";  const char r_5[] = "1993-05-31+12:00";
    const char c_6[] = " 1994-01-01+12:01 ";  const char r_6[] = "1993-12-31-11:59";
    const char c_7[] = " 1994-01-01+14:00 ";  const char r_7[] = "1993-12-31-10:00";
    const char c_8[] = " 1993-06-01-00:00 ";  const char r_8[] = "1993-06-01Z";
    const char c_9[] = " 1993-06-01-00:01 ";  const char r_9[] = "1993-06-01-00:01";
    const char c_a[] = " 1993-06-01-11:59 ";  const char r_a[] = "1993-06-01-11:59";
    const char c_b[] = " 1993-05-31-12:00 ";  const char r_b[] = "1993-06-01+12:00";
    const char c_c[] = " 1993-05-31-14:00 ";  const char r_c[] = "1993-06-01+10:00";

    act_v_ran_v_1.fValue.f_datetime.f_year    = 1991;
    act_v_ran_v_1.fValue.f_datetime.f_month   = 05;
    act_v_ran_v_1.fValue.f_datetime.f_day     = 31;
    act_v_ran_v_1.fValue.f_datetime.f_hour    = 0;
    act_v_ran_v_1.fValue.f_datetime.f_min     = 0;
    act_v_ran_v_1.fValue.f_datetime.f_second  = 0;
    act_v_ran_v_1.fValue.f_datetime.f_milisec = 0;

    act_v_ran_v_2.fValue.f_datetime.f_year    = 9999;
    act_v_ran_v_2.fValue.f_datetime.f_month   = 06;
    act_v_ran_v_2.fValue.f_datetime.f_day     = 30;
    act_v_ran_v_2.fValue.f_datetime.f_hour    = 0;
    act_v_ran_v_2.fValue.f_datetime.f_min     = 0;
    act_v_ran_v_2.fValue.f_datetime.f_second  = 0;
    act_v_ran_v_2.fValue.f_datetime.f_milisec = 0;

    act_v_ran_v_3.fValue.f_datetime.f_year    = 99991;
    act_v_ran_v_3.fValue.f_datetime.f_month   = 07;
    act_v_ran_v_3.fValue.f_datetime.f_day     = 30;
    act_v_ran_v_3.fValue.f_datetime.f_hour    = 0;
    act_v_ran_v_3.fValue.f_datetime.f_min     = 0;
    act_v_ran_v_3.fValue.f_datetime.f_second  = 0;
    act_v_ran_v_3.fValue.f_datetime.f_milisec = 0;

    /***
     *
     * validate
     * ---------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *     valid                                       true              n/a
     *     invalid                                     false             st_FOCA0002
     *
     ***/

    //  valid
    VALIDATE_TEST(v_1,  dt, EXP_RET_VALID_TRUE,  DONT_CARE);
    VALIDATE_TEST(v_2,  dt, EXP_RET_VALID_TRUE,  DONT_CARE);
    VALIDATE_TEST(v_3,  dt, EXP_RET_VALID_TRUE,  DONT_CARE);

    //  invalid
    VALIDATE_TEST(iv_1, dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);
    VALIDATE_TEST(iv_2, dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);
    VALIDATE_TEST(iv_3, dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);

    /***
     *
     * getActualValue
     * ---------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *   valid                                          XSValue         n/a
     *   invalid                                           0            st_FOCA0002
     *
     *  validation off
     *  ==============
     *   valid                                          XSValue         n/a
     *   invalid                                           0            st_FOCA0002
     *
     ***/

    for (int i = 0; i < 2; i++)
    {
        //validation on/off
        toValidate = ( 0 == i) ? true : false;

        //  valid
        ACTVALUE_TEST(v_1,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_1);
        ACTVALUE_TEST(v_2,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_2);
        ACTVALUE_TEST(v_3,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_3);

        //  invalid
        ACTVALUE_TEST(iv_1, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_1);
        ACTVALUE_TEST(iv_2, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_1);
        ACTVALUE_TEST(iv_3, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_1);
    }

    /***
     *
     * getCanonicalRepresentation
     * ---------------------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *
     *  validation on
     *  =============
     *   valid                                          XMLCh            st_NoCanRep
     *   invalid                                          0              st_FOCA0002
     *
     *  validation off
     *  ==============
     *   valid                                          XMLCh            st_NoCanRep
     *   invalid                                          0              st_NoCanRep
     *
     ***/

    for (int j = 0; j < 2; j++)
    {
        //validation on/off
        toValidate = ( 0 == j) ? true : false;

        //  valid
        CANREP_TEST(v_1,  dt, toValidate, EXP_RET_CANREP_TRUE, v_1_canrep, DONT_CARE);
        CANREP_TEST(v_2,  dt, toValidate, EXP_RET_CANREP_TRUE, v_2_canrep, DONT_CARE);
        CANREP_TEST(v_3,  dt, toValidate, EXP_RET_CANREP_TRUE, v_3_canrep, DONT_CARE);

        CANREP_TEST(c_1,  dt, toValidate, EXP_RET_CANREP_TRUE, r_1, DONT_CARE);
        CANREP_TEST(c_2,  dt, toValidate, EXP_RET_CANREP_TRUE, r_2, DONT_CARE);
        CANREP_TEST(c_3,  dt, toValidate, EXP_RET_CANREP_TRUE, r_3, DONT_CARE);
        CANREP_TEST(c_4,  dt, toValidate, EXP_RET_CANREP_TRUE, r_4, DONT_CARE);
        CANREP_TEST(c_5,  dt, toValidate, EXP_RET_CANREP_TRUE, r_5, DONT_CARE);
        CANREP_TEST(c_6,  dt, toValidate, EXP_RET_CANREP_TRUE, r_6, DONT_CARE);
        CANREP_TEST(c_7,  dt, toValidate, EXP_RET_CANREP_TRUE, r_7, DONT_CARE);
        CANREP_TEST(c_8,  dt, toValidate, EXP_RET_CANREP_TRUE, r_8, DONT_CARE);
        CANREP_TEST(c_9,  dt, toValidate, EXP_RET_CANREP_TRUE, r_9, DONT_CARE);
        CANREP_TEST(c_a,  dt, toValidate, EXP_RET_CANREP_TRUE, r_a, DONT_CARE);
        CANREP_TEST(c_b,  dt, toValidate, EXP_RET_CANREP_TRUE, r_b, DONT_CARE);
        CANREP_TEST(c_c,  dt, toValidate, EXP_RET_CANREP_TRUE, r_c, DONT_CARE);

        //  invalid
        CANREP_TEST(iv_1, dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_FOCA0002);
        CANREP_TEST(iv_2, dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_FOCA0002);
        CANREP_TEST(iv_3, dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_FOCA0002);

    }

}